

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-attack.c
# Opt level: O0

void hit_chance(random_chance *chance,wchar_t to_hit,wchar_t ac)

{
  int local_2c;
  wchar_t local_28;
  wchar_t ALWAYS_MISS;
  wchar_t ALWAYS_HIT;
  wchar_t HUNDRED_PCT;
  wchar_t ac_local;
  wchar_t to_hit_local;
  random_chance *chance_local;
  
  local_28 = to_hit;
  if (to_hit < L'\n') {
    local_28 = L'\t';
  }
  if (local_28 - (ac << 1) / 3 < 1) {
    local_2c = 0;
  }
  else {
    local_2c = local_28 - (ac << 1) / 3;
  }
  chance->numerator = local_2c;
  chance->denominator = local_28;
  chance->numerator = (chance->numerator * 10000) / chance->denominator;
  chance->denominator = 10000;
  chance->numerator = (chance->numerator * 0x206c) / 10000;
  chance->numerator = chance->numerator + 0x4b0;
  return;
}

Assistant:

void hit_chance(random_chance *chance, int to_hit, int ac)
{
	/* Percentages scaled to 10,000 to avoid rounding error */
	const int HUNDRED_PCT = 10000;
	const int ALWAYS_HIT = 1200;
	const int ALWAYS_MISS = 500;

	/* Put a floor on the to_hit */
	to_hit = MAX(9, to_hit);

	/* Calculate the hit percentage */
	chance->numerator = MAX(0, to_hit - ac * 2 / 3);
	chance->denominator = to_hit;

	/* Convert the ratio to a scaled percentage */
	chance->numerator = HUNDRED_PCT * chance->numerator / chance->denominator;
	chance->denominator = HUNDRED_PCT;

	/* The calculated rate only applies when the guaranteed hit/miss don't */
	chance->numerator = chance->numerator *
			(HUNDRED_PCT - ALWAYS_MISS - ALWAYS_HIT) / HUNDRED_PCT;

	/* Add in the guaranteed hit */
	chance->numerator += ALWAYS_HIT;
}